

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

double __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadConstant
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *this,char code)

{
  TextReader<fmt::Locale> *this_00;
  short sVar1;
  int iVar2;
  undefined7 in_register_00000031;
  double dVar3;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  this_00 = this->reader_;
  iVar2 = (int)CONCAT71(in_register_00000031,code);
  if (iVar2 == 0x6c) {
    iVar2 = TextReader<fmt::Locale>::ReadInt<int>(this_00);
  }
  else {
    if (iVar2 != 0x73) {
      if (iVar2 == 0x6e) {
        dVar3 = TextReader<fmt::Locale>::ReadDouble(this_00);
      }
      else {
        local_18.field_1.values_ = (Value *)&local_28;
        local_28 = 0;
        uStack_20 = 0;
        local_18.types_ = 0;
        TextReader<fmt::Locale>::DoReportError
                  (this_00,(this_00->super_ReaderBase).token_,(CStringRef)0x139eee,&local_18);
        dVar3 = 0.0;
      }
      goto LAB_00106be9;
    }
    sVar1 = TextReader<fmt::Locale>::ReadInt<short>(this_00);
    iVar2 = (int)sVar1;
  }
  dVar3 = (double)iVar2;
LAB_00106be9:
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  return dVar3;
}

Assistant:

double NLReader<Reader, Handler>::ReadConstant(char code) {
  double value = 0;
  switch (code) {
  case 'n':
    value = reader_.ReadDouble();
    break;
  case 's':
    value = reader_.template ReadInt<short>();
    break;
  case 'l':
    // The following check is necessary for compatibility with ASL.
    if (sizeof(double) == 2 * sizeof(int))
      value = reader_.template ReadInt<int>();
    else
      value = reader_.template ReadInt<long>();
    break;
  default:
    reader_.ReportError("expected constant");
  }
  reader_.ReadTillEndOfLine();
  return value;
}